

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

void __thiscall
DSectorScrollInterpolation::DSectorScrollInterpolation
          (DSectorScrollInterpolation *this,sector_t_conflict *_sector,bool _plane)

{
  double dVar1;
  undefined3 in_register_00000011;
  
  DObject::DObject((DObject *)this);
  (this->super_DInterpolation).Next.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).refcount = 0;
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_0070b0a0;
  this->sector = _sector;
  this->ceiling = _plane;
  dVar1 = _sector->planes[CONCAT31(in_register_00000011,_plane)].xform.yOffs;
  this->oldx = _sector->planes[CONCAT31(in_register_00000011,_plane)].xform.xOffs;
  this->oldy = dVar1;
  (this->super_DInterpolation).Next.field_0 = interpolator.Head.field_0;
  if ((interpolator.Head.field_0 != (DInterpolation *)0x0) &&
     ((*(byte *)((long)interpolator.Head.field_0 + 0x20) & 0x20) == 0)) {
    *(DSectorScrollInterpolation **)((long)interpolator.Head.field_0 + 0x30) = this;
  }
  (this->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
  interpolator.Head.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)this;
  interpolator.count = interpolator.count + 1;
  return;
}

Assistant:

DSectorScrollInterpolation::DSectorScrollInterpolation(sector_t *_sector, bool _plane)
{
	sector = _sector;
	ceiling = _plane;
	UpdateInterpolation ();
	interpolator.AddInterpolation(this);
}